

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

int kj::_::Debug::
    syscallError<kj::_::Mutex::wait(kj::_::Mutex::Predicate&,kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>,kj::NoopSourceLocation)::__2>
              (anon_class_16_2_8071f6fa *call,bool nonblocking)

{
  int iVar1;
  long lVar2;
  int errorNum;
  bool nonblocking_local;
  anon_class_16_2_8071f6fa *call_local;
  
  do {
    lVar2 = Mutex::wait::anon_class_16_2_8071f6fa::operator()(call);
    if (-1 < lVar2) {
      return 0;
    }
    iVar1 = getOsErrorNumber(nonblocking);
  } while (iVar1 == -1);
  return iVar1;
}

Assistant:

int Debug::syscallError(Call&& call, bool nonblocking) {
  while (call() < 0) {
    int errorNum = getOsErrorNumber(nonblocking);
    // getOsErrorNumber() returns -1 to indicate EINTR.
    // Also, if nonblocking is true, then it returns 0 on EAGAIN, which will then be treated as a
    // non-error.
    if (errorNum != -1) {
      return errorNum;
    }
  }
  return 0;
}